

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

_Bool borg_teleport_off_level(void)

{
  _Bool _Var1;
  
  if ((borg.goal.recalling == L'\0') && (borg.goal.descending == L'\0')) {
    _Var1 = borg_read_scroll(sv_scroll_teleport_level);
    if ((_Var1) || (_Var1 = borg_activate_item(act_tele_level), _Var1)) {
      return true;
    }
    _Var1 = borg_activate_item(act_deep_descent);
    if ((_Var1) || (_Var1 = borg_read_scroll(sv_scroll_deep_descent), _Var1)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool borg_teleport_off_level(void)
{
    /* don't if we are already recalling or waiting for */
    /* deep descent */
    if (!(borg.goal.recalling || borg.goal.descending)) {
        /* teleport level before deep descent because there is no delay */
        if (borg_read_scroll(sv_scroll_teleport_level)
            || borg_activate_item(act_tele_level))
            return true;

        if (borg_activate_item(act_deep_descent)
            || borg_read_scroll(sv_scroll_deep_descent))
            return true;
    }

    return false;
}